

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeoelrefless.h.h
# Opt level: O0

void __thiscall
TPZGeoElRefLess<pzgeom::TPZQuadraticQuad>::GradX
          (TPZGeoElRefLess<pzgeom::TPZQuadraticQuad> *this,TPZVec<Fad<double>_> *par,
          TPZFMatrix<Fad<double>_> *gradx)

{
  long *in_RDX;
  TPZFNMatrix<54,_double> cornerco;
  int64_t in_stack_fffffffffffffd90;
  TPZFMatrix<double> *in_stack_fffffffffffffd98;
  TPZFNMatrix<54,_double> *in_stack_fffffffffffffda0;
  
  (**(code **)(*in_RDX + 0x68))(in_RDX,3,2);
  TPZFNMatrix<54,_double>::TPZFNMatrix
            (in_stack_fffffffffffffda0,(int64_t)in_stack_fffffffffffffd98,in_stack_fffffffffffffd90)
  ;
  CornerCoordinates((TPZGeoElRefLess<pzgeom::TPZQuadraticQuad> *)in_stack_fffffffffffffda0,
                    in_stack_fffffffffffffd98);
  pzgeom::TPZQuadraticQuad::GradX<Fad<double>>
            ((TPZFMatrix<double> *)cornerco.super_TPZFMatrix<double>.fWork.fStore,
             (TPZVec<Fad<double>_> *)cornerco.super_TPZFMatrix<double>.fWork._vptr_TPZVec,
             (TPZFMatrix<Fad<double>_> *)cornerco.super_TPZFMatrix<double>.fPivot._48_8_);
  TPZFNMatrix<54,_double>::~TPZFNMatrix((TPZFNMatrix<54,_double> *)0x1798a9a);
  return;
}

Assistant:

void
TPZGeoElRefLess<TGeo>::GradX(TPZVec<Fad<REAL> > &par, TPZFMatrix<Fad<REAL> > &gradx) const
{
    gradx.Resize(3,fGeo.Dimension);
    TPZFNMatrix<54,REAL> cornerco(3,fGeo.NNodes);
    CornerCoordinates(cornerco);
    fGeo.GradX(cornerco,par,gradx);
}